

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderTessellationgl_TessCoord::deinitTestDescriptor
          (TessellationShaderTessellationgl_TessCoord *this,_test_descriptor *test)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (test->po_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    test->po_id = 0;
  }
  if (test->tc_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    test->tc_id = 0;
  }
  if (test->te_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    test->te_id = 0;
  }
  return;
}

Assistant:

void TessellationShaderTessellationgl_TessCoord::deinitTestDescriptor(_test_descriptor& test)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (test.po_id != 0)
	{
		gl.deleteProgram(test.po_id);

		test.po_id = 0;
	}

	if (test.tc_id != 0)
	{
		gl.deleteShader(test.tc_id);

		test.tc_id = 0;
	}

	if (test.te_id != 0)
	{
		gl.deleteShader(test.te_id);

		test.te_id = 0;
	}
}